

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::anon_unknown_129::dynamicCheckTestMessage<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  double dVar1;
  ListElementCount LVar2;
  ReaderFor<bool> RVar3;
  int8_t iVar4;
  uint8_t uVar5;
  bool bVar6;
  int16_t iVar7;
  uint16_t uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  int64_t iVar11;
  StructSchema SVar12;
  uint64_t uVar13;
  size_type sVar14;
  float fVar15;
  ReaderFor<DynamicEnum> RVar16;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  initializer_list<capnp::Void> expected;
  StringPtr name_64;
  initializer_list<bool> expected_00;
  StringPtr name_65;
  initializer_list<signed_char> expected_01;
  StringPtr name_66;
  initializer_list<short> expected_02;
  StringPtr name_67;
  initializer_list<int> expected_03;
  StringPtr name_68;
  initializer_list<long> expected_04;
  StringPtr name_69;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_70;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_71;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_72;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_73;
  initializer_list<float> expected_09;
  StringPtr name_74;
  initializer_list<double> expected_10;
  StringPtr name_75;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_76;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  initializer_list<const_char_*> expected_13;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  initializer_list<bool> expected_14;
  StringPtr name_90;
  initializer_list<signed_char> expected_15;
  StringPtr name_91;
  initializer_list<short> expected_16;
  StringPtr name_92;
  initializer_list<int> expected_17;
  StringPtr name_93;
  initializer_list<long> expected_18;
  StringPtr name_94;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_95;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_96;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_97;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_98;
  StringPtr name_99;
  StringPtr name_x00100;
  initializer_list<capnp::Text::Reader> expected_23;
  StringPtr name_x00101;
  initializer_list<capnp::Data::Reader> expected_24;
  StringPtr name_x00102;
  StringPtr name_x00103;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  initializer_list<const_char_*> expected_25;
  Fault f;
  char *pcStack_920;
  ReaderFor<capnp::DynamicList> listReader_1;
  ReaderFor<capnp::DynamicStruct> subReader;
  ReaderFor<capnp::DynamicStruct> subSubReader;
  ArrayPtr<const_char> local_810;
  ReaderFor<DynamicStruct> local_800;
  Reader local_7c8;
  Reader local_780;
  Reader local_738;
  Reader local_6f0;
  Reader local_6a8;
  Reader local_660;
  Reader local_618;
  Reader local_5d0;
  Reader local_588;
  Reader local_540;
  Reader local_4f8;
  Reader local_4b0;
  Reader local_468;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Reader local_348;
  Reader local_300;
  Reader local_2b8;
  Reader local_270;
  Reader local_228;
  Reader local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  name_00.content.size_ = 10;
  name_00.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_00);
  RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!RVar3 && kj::_::Debug::minSeverity < 3) {
    listReader_1.schema.elementType.baseType._0_1_ = 1;
    name_01.content.size_ = 10;
    name_01.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_01);
    subSubReader.schema.super_Schema.raw._0_1_ =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[73],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x153,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (bool *)&listReader_1,(bool *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_02.content.size_ = 10;
  name_02.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_02);
  iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar4 != -0x7b) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xff85;
    listReader_1.schema.elementType.listDepth = 0xff;
    listReader_1.schema.elementType.isImplicitParam = true;
    name_03.content.size_ = 10;
    name_03.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_03);
    iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_1_ = iVar4;
    kj::_::Debug::log<char_const(&)[75],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x154,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (int *)&listReader_1,(char *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_04);
  iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar7 != -0x3039) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xcfc7;
    listReader_1.schema.elementType.listDepth = 0xff;
    listReader_1.schema.elementType.isImplicitParam = true;
    name_05.content.size_ = 0xb;
    name_05.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_05);
    iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_2_ = iVar7;
    kj::_::Debug::log<char_const(&)[79],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (int *)&listReader_1,(short *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_06.content.size_ = 0xb;
  name_06.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_06);
  iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar9 != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x9eb2;
    listReader_1.schema.elementType.listDepth = 'C';
    listReader_1.schema.elementType.isImplicitParam = true;
    name_07.content.size_ = 0xb;
    name_07.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_07);
    iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[82],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&listReader_1,(int *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_08);
  iVar11 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar11 != -0x7048860ddf79) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x2087;
    listReader_1.schema.elementType.listDepth = 0xf2;
    listReader_1.schema.elementType.isImplicitParam = true;
    listReader_1.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x8fb7;
    listReader_1.schema.elementType._6_2_ = 0xffff;
    name_09.content.size_ = 0xb;
    name_09.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_09);
    SVar12.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
    kj::_::Debug::log<char_const(&)[91],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&listReader_1,(long *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_10);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar5 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xea;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    name_11.content.size_ = 0xb;
    name_11.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_11);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_1_ = uVar5;
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&listReader_1,(uchar *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_12.content.size_ = 0xc;
  name_12.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_12);
  uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar8 != 0xb26e) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xb26e;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    name_13.content.size_ = 0xc;
    name_13.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_13);
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_2_ = uVar8;
    kj::_::Debug::log<char_const(&)[81],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&listReader_1,(unsigned_short *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_14.content.size_ = 0xc;
  name_14.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_14);
  uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar10 != 0xce0a6a14) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x6a14;
    listReader_1.schema.elementType.listDepth = '\n';
    listReader_1.schema.elementType.isImplicitParam = true;
    name_15.content.size_ = 0xc;
    name_15.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_15);
    uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_4_ = uVar10;
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&listReader_1,(uint *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_16.content.size_ = 0xc;
  name_16.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_16);
  uVar13 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar13 != 0xab54a98ceb1f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xad2;
    listReader_1.schema.elementType.listDepth = '\x1f';
    listReader_1.schema.elementType.isImplicitParam = true;
    listReader_1.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0xa98c;
    listReader_1.schema.elementType._6_2_ = 0xab54;
    name_17.content.size_ = 0xc;
    name_17.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_17);
    SVar12.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
    kj::_::Debug::log<char_const(&)[98],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&listReader_1,(unsigned_long *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_18.content.size_ = 0xd;
  name_18.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_18);
  fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
  bVar6 = kj::_::floatAlmostEqual(fVar15,1234.5);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_19.content.size_ = 0xd;
    name_19.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_19);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    listReader_1.schema.elementType._0_4_ = fVar15;
    subSubReader.schema.super_Schema.raw._0_4_ = 0x449a5000;
    kj::_::Debug::log<char_const(&)[101],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15c,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", reader.get(\"float32Field\").template as<float>(), 1234.5f"
               ,(char (*) [101])
                "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
               ,(float *)&listReader_1,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_20.content.size_ = 0xd;
  name_20.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_20);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
  bVar6 = kj::_::doubleAlmostEqual(dVar1,-1.23e+47);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_21.content.size_ = 0xd;
    name_21.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_21);
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
    listReader_1.schema.elementType._0_8_ = dVar1;
    subSubReader.schema.super_Schema.raw = (Schema)0xc9b58b82c0e0bb00;
    kj::_::Debug::log<char_const(&)[103],double,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15d,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", reader.get(\"float64Field\").template as<double>(), -123e45"
               ,(char (*) [103])
                "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
               ,(double *)&listReader_1,(double *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_22.content.size_ = 10;
  name_22.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_22);
  listReader_1.schema.elementType =
       (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("foo",(StringPtr *)&listReader_1);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_23.content.size_ = 10;
    name_23.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_23);
    listReader_1.schema.elementType =
         (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[74],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15e,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"foo\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [74])
                "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
               (char (*) [4])"foo",(Reader *)&listReader_1);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  listReader_1.schema.elementType = (Type)_::data("bar");
  name_24.content.size_ = 10;
  name_24.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_24);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&listReader_1,
                     (ArrayPtr<const_unsigned_char> *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    listReader_1.schema.elementType = (Type)_::data("bar");
    name_25.content.size_ = 10;
    name_25.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_25);
    subSubReader._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
               ,(Reader *)&listReader_1,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_26.content.size_ = 0xc;
  name_26.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_26);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&subReader,(Reader *)&f)
  ;
  DynamicValue::Reader::~Reader((Reader *)&f);
  name_27.content.size_ = 10;
  name_27.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_27);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  name_28.content.size_ = 10;
  name_28.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_28);
  RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!RVar3 && kj::_::Debug::minSeverity < 3) {
    listReader_1.schema.elementType.baseType._0_1_ = 1;
    name_29.content.size_ = 10;
    name_29.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_29);
    RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_1_ = RVar3;
    kj::_::Debug::log<char_const(&)[76],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (bool *)&listReader_1,(bool *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_30);
  iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar4 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = ~FLOAT64;
    listReader_1.schema.elementType.listDepth = 0xff;
    listReader_1.schema.elementType.isImplicitParam = true;
    name_31.content.size_ = 10;
    name_31.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_31);
    iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_1_ = iVar4;
    kj::_::Debug::log<char_const(&)[77],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (int *)&listReader_1,(char *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_32.content.size_ = 0xb;
  name_32.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_32);
  iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar7 != 0xd80) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xd80;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    name_33.content.size_ = 0xb;
    name_33.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_33);
    iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_2_ = iVar7;
    kj::_::Debug::log<char_const(&)[80],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (int *)&listReader_1,(short *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_34);
  iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar9 != -0x4b3eff2) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x100e;
    listReader_1.schema.elementType.listDepth = 'L';
    listReader_1.schema.elementType.isImplicitParam = true;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_35);
    iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[85],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&listReader_1,(int *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_36);
  iVar11 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((iVar11 != 0x33a638e8734e) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x734e;
    listReader_1.schema.elementType.listDepth = 0xe8;
    listReader_1.schema.elementType.isImplicitParam = true;
    listReader_1.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x33a6;
    listReader_1.schema.elementType._6_2_ = 0;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_37);
    SVar12.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
    kj::_::Debug::log<char_const(&)[92],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x167,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&listReader_1,(long *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_38);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar5 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x5a;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_39);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_1_ = uVar5;
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&listReader_1,(uchar *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_40.content.size_ = 0xc;
  name_40.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_40);
  uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar8 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x4d2;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    name_41.content.size_ = 0xc;
    name_41.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_41);
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_2_ = uVar8;
    kj::_::Debug::log<char_const(&)[83],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&listReader_1,(unsigned_short *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_42);
  uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar10 != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0x8814;
    listReader_1.schema.elementType.listDepth = 'b';
    listReader_1.schema.elementType.isImplicitParam = true;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_43);
    uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw._0_4_ = uVar10;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&listReader_1,(uint *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_44);
  uVar13 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((uVar13 != 0x4cc1921126f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    listReader_1.schema.elementType.baseType = 0xad2;
    listReader_1.schema.elementType.listDepth = 'o';
    listReader_1.schema.elementType.isImplicitParam = true;
    listReader_1.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x1921;
    listReader_1.schema.elementType._6_2_ = 0x4cc;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_45);
    SVar12.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
    subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
    kj::_::Debug::log<char_const(&)[99],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&listReader_1,(unsigned_long *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_46.content.size_ = 0xd;
  name_46.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_46);
  fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
  bVar6 = kj::_::floatAlmostEqual(fVar15,-1.25e-10);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_47.content.size_ = 0xd;
    name_47.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_47);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    listReader_1.schema.elementType._0_4_ = fVar15;
    subSubReader.schema.super_Schema.raw._0_4_ = 0xaf09705f;
    kj::_::Debug::log<char_const(&)[107],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
               ,(char (*) [107])
                "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
               ,(float *)&listReader_1,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_48);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
  bVar6 = kj::_::doubleAlmostEqual(dVar1,345.0);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_49);
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
    listReader_1.schema.elementType._0_8_ = dVar1;
    subSubReader.schema.super_Schema.raw._0_4_ = 0x159;
    kj::_::Debug::log<char_const(&)[102],double,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", subReader.get(\"float64Field\").template as<double>(), 345"
               ,(char (*) [102])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
               ,(double *)&listReader_1,(int *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_50.content.size_ = 10;
  name_50.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_50);
  listReader_1.schema.elementType =
       (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("baz",(StringPtr *)&listReader_1);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_51.content.size_ = 10;
    name_51.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_51);
    listReader_1.schema.elementType =
         (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[77],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"baz\", subReader.get(\"textField\").template as<Text>()"
               ,(char (*) [77])
                "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())",
               (char (*) [4])0x2cc7a6,(Reader *)&listReader_1);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  listReader_1.schema.elementType = (Type)_::data("qux");
  name_52.content.size_ = 10;
  name_52.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_52);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&listReader_1,
                     (ArrayPtr<const_unsigned_char> *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    listReader_1.schema.elementType = (Type)_::data("qux");
    name_53.content.size_ = 10;
    name_53.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_53);
    subSubReader._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[83],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [83])
                "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(Reader *)&listReader_1,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_54.content.size_ = 0xc;
  name_54.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_54);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&subSubReader,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  name_55.content.size_ = 10;
  name_55.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&subSubReader,name_55);
  listReader_1.schema.elementType =
       (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("nested",(StringPtr *)&listReader_1);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_56.content.size_ = 10;
    name_56.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&subSubReader,name_56);
    listReader_1.schema.elementType =
         (Type)DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[83],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"nested\", subSubReader.get(\"textField\").template as<Text>()"
               ,(char (*) [83])
                "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
               ,(char (*) [7])0x2d9ee1,(Reader *)&listReader_1);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&listReader_1,&subSubReader,name_57);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_800,(Reader *)&listReader_1);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&local_800,name_58);
  local_810 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("really nested",(StringPtr *)&local_810);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Reader::get((Reader *)&listReader_1,&subSubReader,name_59);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_800,(Reader *)&listReader_1);
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&local_800,name_60);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[139],char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,(char (*) [14])"really nested",(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  }
  name_61.content.size_ = 10;
  name_61.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_61);
  RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
  e._8_8_ = RVar16._8_8_;
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = RVar16._8_4_;
  listReader_1.schema.elementType =
       (Type)anon_unknown_129::name
                       ((anon_unknown_129 *)RVar16.schema.super_Schema.raw.super_Schema,e);
  bVar6 = kj::operator==("baz",(StringPtr *)&listReader_1);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_62.content.size_ = 10;
    name_62.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&f,&subReader,name_62);
    RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
    e_00._8_8_ = RVar16._8_8_;
    e_00.schema.super_Schema.raw._4_4_ = 0;
    e_00.schema.super_Schema.raw._0_4_ = RVar16._8_4_;
    listReader_1.schema.elementType =
         (Type)anon_unknown_129::name
                         ((anon_unknown_129 *)RVar16.schema.super_Schema.raw.super_Schema,e_00);
    kj::_::Debug::log<char_const(&)[90],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x176,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [90])
                "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(char (*) [4])0x2cc7a6,(Reader *)&listReader_1);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  sVar14 = 9;
  name_63.content.size_ = 9;
  name_63.content.ptr = "voidList";
  DynamicStruct::Reader::get(&local_78,&subReader,name_63);
  expected._M_len = sVar14;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Reader>((_ *)&local_78,(Reader *)&f,expected);
  DynamicValue::Reader::~Reader(&local_78);
  sVar14 = 9;
  name_64.content.size_ = 9;
  name_64.content.ptr = "boolList";
  DynamicStruct::Reader::get(&local_c0,&subReader,name_64);
  f.exception._0_5_ = 0x101000100;
  expected_00._M_len = sVar14;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_c0,(Reader *)&f,expected_00);
  DynamicValue::Reader::~Reader(&local_c0);
  sVar14 = 9;
  name_65.content.size_ = 9;
  name_65.content.ptr = "int8List";
  DynamicStruct::Reader::get(&local_108,&subReader,name_65);
  f.exception._0_4_ = 0x7f80de0c;
  expected_01._M_len = sVar14;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Reader>((_ *)&local_108,(Reader *)&f,expected_01);
  DynamicValue::Reader::~Reader(&local_108);
  sVar14 = 10;
  name_66.content.size_ = 10;
  name_66.content.ptr = "int16List";
  DynamicStruct::Reader::get(&local_150,&subReader,name_66);
  f.exception = (Exception *)0x7fff8000e9d204d2;
  expected_02._M_len = sVar14;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Reader>((_ *)&local_150,(Reader *)&f,expected_02);
  DynamicValue::Reader::~Reader(&local_150);
  sVar14 = 10;
  name_67.content.size_ = 10;
  name_67.content.ptr = "int32List";
  DynamicStruct::Reader::get(&local_198,&subReader,name_67);
  f.exception = (Exception *)0xfaa0d34000bc614e;
  expected_03._M_len = sVar14;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_198,(Reader *)&f,expected_03);
  DynamicValue::Reader::~Reader(&local_198);
  sVar14 = 10;
  name_68.content.size_ = 10;
  name_68.content.ptr = "int64List";
  DynamicStruct::Reader::get(&local_1e0,&subReader,name_68);
  pcStack_920 = (char *)0xfffd968afd13752e;
  f.exception = (Exception *)0x7048860ddf79;
  expected_04._M_len = sVar14;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Reader>((_ *)&local_1e0,(Reader *)&f,expected_04);
  DynamicValue::Reader::~Reader(&local_1e0);
  sVar14 = 10;
  name_69.content.size_ = 10;
  name_69.content.ptr = "uInt8List";
  DynamicStruct::Reader::get(&local_228,&subReader,name_69);
  f.exception._0_4_ = 0xff00220c;
  expected_05._M_len = sVar14;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Reader>((_ *)&local_228,(Reader *)&f,expected_05);
  DynamicValue::Reader::~Reader(&local_228);
  sVar14 = 0xb;
  name_70.content.size_ = 0xb;
  name_70.content.ptr = "uInt16List";
  DynamicStruct::Reader::get(&local_270,&subReader,name_70);
  f.exception = (Exception *)0xffff0000162e04d2;
  expected_06._M_len = sVar14;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Reader>((_ *)&local_270,(Reader *)&f,expected_06);
  DynamicValue::Reader::~Reader(&local_270);
  sVar14 = 0xb;
  name_71.content.size_ = 0xb;
  name_71.content.ptr = "uInt32List";
  DynamicStruct::Reader::get(&local_2b8,&subReader,name_71);
  f.exception = (Exception *)0x55f2cc000bc614e;
  expected_07._M_len = sVar14;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Reader>((_ *)&local_2b8,(Reader *)&f,expected_07);
  DynamicValue::Reader::~Reader(&local_2b8);
  sVar14 = 0xb;
  name_72.content.size_ = 0xb;
  name_72.content.ptr = "uInt64List";
  DynamicStruct::Reader::get(&local_300,&subReader,name_72);
  f.exception = (Exception *)0x7048860ddf79;
  expected_08._M_len = sVar14;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Reader>((_ *)&local_300,(Reader *)&f,expected_08);
  DynamicValue::Reader::~Reader(&local_300);
  sVar14 = 0xc;
  name_73.content.size_ = 0xc;
  name_73.content.ptr = "float32List";
  DynamicStruct::Reader::get(&local_348,&subReader,name_73);
  f.exception = (Exception *)0x4996b43800000000;
  expected_09._M_len = sVar14;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Reader>((_ *)&local_348,(Reader *)&f,expected_09);
  DynamicValue::Reader::~Reader(&local_348);
  sVar14 = 0xc;
  name_74.content.size_ = 0xc;
  name_74.content.ptr = "float64List";
  DynamicStruct::Reader::get(&local_390,&subReader,name_74);
  f.exception = (Exception *)0x0;
  expected_10._M_len = sVar14;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Reader>((_ *)&local_390,(Reader *)&f,expected_10);
  DynamicValue::Reader::~Reader(&local_390);
  sVar14 = 9;
  name_75.content.size_ = 9;
  name_75.content.ptr = "textList";
  DynamicStruct::Reader::get(&local_3d8,&subReader,name_75);
  pcStack_920 = (char *)0x5;
  f.exception = (Exception *)"quux";
  expected_11._M_len = sVar14;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>((_ *)&local_3d8,(Reader *)&f,expected_11);
  DynamicValue::Reader::~Reader(&local_3d8);
  sVar14 = 9;
  name_76.content.size_ = 9;
  name_76.content.ptr = "dataList";
  DynamicStruct::Reader::get(&local_780,&subReader,name_76);
  _f = (ArrayPtr<const_unsigned_char>)_::data("garply");
  _::data("waldo");
  _::data("fred");
  expected_12._M_len = sVar14;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>((_ *)&local_780,(Reader *)&f,expected_12);
  DynamicValue::Reader::~Reader(&local_780);
  name_77.content.size_ = 0xb;
  name_77.content.ptr = "structList";
  DynamicStruct::Reader::get((Reader *)&f,&subReader,name_77);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&subSubReader,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (subSubReader.reader.dataSize != 3) {
    listReader_1.schema.elementType.baseType = INT16;
    listReader_1.schema.elementType.listDepth = '\0';
    listReader_1.schema.elementType.isImplicitParam = false;
    local_800.schema.super_Schema.raw._0_4_ = subSubReader.reader.dataSize;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x189,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",
               (uint *)&listReader_1,(uint *)&local_800);
    kj::_::Debug::Fault::fatal(&f);
  }
  DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_800,(Reader *)&listReader_1);
  name_78.content.size_ = 10;
  name_78.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&local_800,name_78);
  local_810 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("x structlist 1",(StringPtr *)&local_810);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_800,(Reader *)&listReader_1);
    name_79.content.size_ = 10;
    name_79.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&local_800,name_79);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18a,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 1",(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  }
  DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_800,(Reader *)&listReader_1);
  name_80.content.size_ = 10;
  name_80.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&local_800,name_80);
  local_810 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("x structlist 2",(StringPtr *)&local_810);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_800,(Reader *)&listReader_1);
    name_81.content.size_ = 10;
    name_81.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&local_800,name_81);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 2",(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  }
  DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,2);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_800,(Reader *)&listReader_1);
  name_82.content.size_ = 10;
  name_82.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&f,&local_800,name_82);
  local_810 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
  bVar6 = kj::operator==("x structlist 3",(StringPtr *)&local_810);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,2);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_800,(Reader *)&listReader_1);
    name_83.content.size_ = 10;
    name_83.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&f,&local_800,name_83);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18c,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 3",(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&listReader_1);
  }
  sVar14 = 9;
  name_84.content.size_ = 9;
  name_84.content.ptr = "enumList";
  DynamicStruct::Reader::get(&local_420,&subReader,name_84);
  pcStack_920 = "bar";
  f.exception = (Exception *)"qux";
  expected_13._M_len = sVar14;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Reader>
            ((anon_unknown_129 *)&local_420,(Reader *)&f,expected_13);
  DynamicValue::Reader::~Reader(&local_420);
  name_85.content.size_ = 10;
  name_85.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_85);
  RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
  e_01._8_8_ = RVar16._8_8_;
  e_01.schema.super_Schema.raw._4_4_ = 0;
  e_01.schema.super_Schema.raw._0_4_ = RVar16._8_4_;
  listReader_1.schema.elementType =
       (Type)anon_unknown_129::name
                       ((anon_unknown_129 *)RVar16.schema.super_Schema.raw.super_Schema,e_01);
  bVar6 = kj::operator==("corge",(StringPtr *)&listReader_1);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (!bVar6 && kj::_::Debug::minSeverity < 3) {
    name_86.content.size_ = 10;
    name_86.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_86);
    RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
    e_02._8_8_ = RVar16._8_8_;
    e_02.schema.super_Schema.raw._4_4_ = 0;
    e_02.schema.super_Schema.raw._0_4_ = RVar16._8_4_;
    listReader_1.schema.elementType =
         (Type)anon_unknown_129::name
                         ((anon_unknown_129 *)RVar16.schema.super_Schema.raw.super_Schema,e_02);
    kj::_::Debug::log<char_const(&)[89],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,400,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [89])
                "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(char (*) [6])"corge",(Reader *)&listReader_1);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  name_87.content.size_ = 9;
  name_87.content.ptr = "voidList";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_87);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&listReader_1,(Reader *)&f);
  LVar2 = listReader_1.reader.elementCount;
  DynamicValue::Reader::~Reader((Reader *)&f);
  if ((LVar2 != 6) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 6;
    name_88.content.size_ = 9;
    name_88.content.ptr = "voidList";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_88);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&listReader_1,(Reader *)&f);
    subReader.schema.super_Schema.raw._0_4_ = (float)listReader_1.reader.elementCount;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x192,ERROR,
               "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
               ,(uint *)&subSubReader,(uint *)&subReader);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  sVar14 = 9;
  name_89.content.size_ = 9;
  name_89.content.ptr = "boolList";
  DynamicStruct::Reader::get(&local_468,&reader,name_89);
  f.exception._0_4_ = 0x1000001;
  expected_14._M_len = sVar14;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_468,(Reader *)&f,expected_14);
  DynamicValue::Reader::~Reader(&local_468);
  sVar14 = 9;
  name_90.content.size_ = 9;
  name_90.content.ptr = "int8List";
  DynamicStruct::Reader::get(&local_4b0,&reader,name_90);
  f.exception._0_2_ = 0x916f;
  expected_15._M_len = sVar14;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Reader>((_ *)&local_4b0,(Reader *)&f,expected_15);
  DynamicValue::Reader::~Reader(&local_4b0);
  sVar14 = 10;
  name_91.content.size_ = 10;
  name_91.content.ptr = "int16List";
  DynamicStruct::Reader::get(&local_4f8,&reader,name_91);
  f.exception._0_4_ = 0xd4992b67;
  expected_16._M_len = sVar14;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Reader>((_ *)&local_4f8,(Reader *)&f,expected_16);
  DynamicValue::Reader::~Reader(&local_4f8);
  sVar14 = 10;
  name_92.content.size_ = 10;
  name_92.content.ptr = "int32List";
  DynamicStruct::Reader::get(&local_540,&reader,name_92);
  f.exception = (Exception *)0xf9609439069f6bc7;
  expected_17._M_len = sVar14;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_540,(Reader *)&f,expected_17);
  DynamicValue::Reader::~Reader(&local_540);
  sVar14 = 10;
  name_93.content.size_ = 10;
  name_93.content.ptr = "int64List";
  DynamicStruct::Reader::get(&local_588,&reader,name_93);
  pcStack_920 = (char *)0xf0948a54d43b8e39;
  f.exception = (Exception *)0xf6b75ab2bc471c7;
  expected_18._M_len = sVar14;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Reader>((_ *)&local_588,(Reader *)&f,expected_18);
  DynamicValue::Reader::~Reader(&local_588);
  sVar14 = 10;
  name_94.content.size_ = 10;
  name_94.content.ptr = "uInt8List";
  DynamicStruct::Reader::get(&local_5d0,&reader,name_94);
  f.exception._0_2_ = 0xde6f;
  expected_19._M_len = sVar14;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Reader>((_ *)&local_5d0,(Reader *)&f,expected_19);
  DynamicValue::Reader::~Reader(&local_5d0);
  sVar14 = 0xb;
  name_95.content.size_ = 0xb;
  name_95.content.ptr = "uInt16List";
  DynamicStruct::Reader::get(&local_618,&reader,name_95);
  f.exception._0_4_ = 0xad9c8235;
  expected_20._M_len = sVar14;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Reader>((_ *)&local_618,(Reader *)&f,expected_20);
  DynamicValue::Reader::~Reader(&local_618);
  sVar14 = 0xb;
  name_96.content.size_ = 0xb;
  name_96.content.ptr = "uInt32List";
  DynamicStruct::Reader::get(&local_660,&reader,name_96);
  f.exception._0_4_ = 0xc6aea155;
  expected_21._M_len = sVar14;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Reader>((_ *)&local_660,(Reader *)&f,expected_21);
  DynamicValue::Reader::~Reader(&local_660);
  sVar14 = 0xb;
  name_97.content.size_ = 0xb;
  name_97.content.ptr = "uInt64List";
  DynamicStruct::Reader::get(&local_6a8,&reader,name_97);
  f.exception = (Exception *)0x9a3298afb5ac71c7;
  expected_22._M_len = sVar14;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Reader>((_ *)&local_6a8,(Reader *)&f,expected_22);
  DynamicValue::Reader::~Reader(&local_6a8);
  name_98.content.size_ = 0xc;
  name_98.content.ptr = "float32List";
  DynamicStruct::Reader::get((Reader *)&f,&reader,name_98);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&listReader_1,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  if (listReader_1.reader.elementCount == 4) {
    DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,0);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (((fVar15 != 5555.5) || (NAN(fVar15))) && (kj::_::Debug::minSeverity < 3)) {
      subSubReader.schema.super_Schema.raw._0_4_ = 0x45ad9c00;
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,0);
      fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      subReader.schema.super_Schema.raw._0_4_ = fVar15;
      kj::_::Debug::log<char_const(&)[67],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x19f,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", 5555.5f, listReader[0].template as<float>()"
                 ,(char (*) [67])
                  "failed: expected (5555.5f) == (listReader[0].template as<float>())",
                 (float *)&subSubReader,(float *)&subReader);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,1);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if ((fVar15 < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
      subSubReader.schema.super_Schema.raw._0_4_ = 0x7f800000;
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,1);
      fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      subReader.schema.super_Schema.raw._0_4_ = fVar15;
      kj::_::Debug::log<char_const(&)[69],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a0,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", kj::inf(), listReader[1].template as<float>()"
                 ,(char (*) [69])
                  "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
                 (float *)&subSubReader,(float *)&subReader);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,2);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if ((-INFINITY < fVar15) && (kj::_::Debug::minSeverity < 3)) {
      subSubReader.schema.super_Schema.raw._0_4_ = 0xff800000;
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,2);
      fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      subReader.schema.super_Schema.raw._0_4_ = fVar15;
      kj::_::Debug::log<char_const(&)[70],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a1,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", -kj::inf(), listReader[2].template as<float>()"
                 ,(char (*) [70])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                 (float *)&subSubReader,(float *)&subReader);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,3);
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if ((!NAN(fVar15)) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a2,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<float>())\"",
                 (char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())");
    }
    name_99.content.size_ = 0xc;
    name_99.content.ptr = "float64List";
    DynamicStruct::Reader::get((Reader *)&f,&reader,name_99);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&listReader_1,(Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (listReader_1.reader.elementCount == 4) {
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,0);
      dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if (((dVar1 != 7777.75) || (NAN(dVar1))) && (kj::_::Debug::minSeverity < 3)) {
        subSubReader.schema.super_Schema.raw = (Schema)0x40be61c000000000;
        DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,0);
        subReader.schema.super_Schema.raw =
             (Schema)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
        kj::_::Debug::log<char_const(&)[68],double,double>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a7,ERROR,
                   "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", 7777.75, listReader[0].template as<double>()"
                   ,(char (*) [68])
                    "failed: expected (7777.75) == (listReader[0].template as<double>())",
                   (double *)&subSubReader,(double *)&subReader);
        DynamicValue::Reader::~Reader((Reader *)&f);
      }
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,1);
      dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if ((dVar1 < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
        subReader.schema.super_Schema.raw._0_4_ = INFINITY;
        DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,1);
        SVar12.super_Schema.raw =
             (Schema)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
        subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
        kj::_::Debug::log<char_const(&)[70],float,double>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a8,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", kj::inf(), listReader[1].template as<double>()"
                   ,(char (*) [70])
                    "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                   (float *)&subReader,(double *)&subSubReader);
        DynamicValue::Reader::~Reader((Reader *)&f);
      }
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,2);
      dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if ((-INFINITY < dVar1) && (kj::_::Debug::minSeverity < 3)) {
        subReader.schema.super_Schema.raw._0_4_ = -INFINITY;
        DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,2);
        SVar12.super_Schema.raw =
             (Schema)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
        subSubReader.schema.super_Schema.raw = SVar12.super_Schema.raw;
        kj::_::Debug::log<char_const(&)[71],float,double>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a9,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", -kj::inf(), listReader[2].template as<double>()"
                   ,(char (*) [71])
                    "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                   (float *)&subReader,(double *)&subSubReader);
        DynamicValue::Reader::~Reader((Reader *)&f);
      }
      DynamicList::Reader::operator[]((Reader *)&f,&listReader_1,3);
      dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if ((!NAN(dVar1)) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[60]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1aa,ERROR,
                   "\"failed: expected \" \"isNaN(listReader[3].template as<double>())\"",
                   (char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())");
      }
      name_x00100.content.size_ = 9;
      name_x00100.content.ptr = "textList";
      DynamicStruct::Reader::get(&local_6f0,&reader,name_x00100);
      pcStack_920 = (char *)0x6;
      f.exception = (Exception *)"plugh";
      expected_23._M_len = 6;
      expected_23._M_array = (iterator)0x3;
      checkList<capnp::Text,capnp::DynamicValue::Reader>((_ *)&local_6f0,(Reader *)&f,expected_23);
      DynamicValue::Reader::~Reader(&local_6f0);
      sVar14 = 9;
      name_x00101.content.size_ = 9;
      name_x00101.content.ptr = "dataList";
      DynamicStruct::Reader::get(&local_7c8,&reader,name_x00101);
      _f = (ArrayPtr<const_unsigned_char>)_::data("oops");
      _::data("exhausted");
      _::data("rfc3092");
      expected_24._M_len = sVar14;
      expected_24._M_array = (iterator)0x3;
      checkList<capnp::Data,capnp::DynamicValue::Reader>((_ *)&local_7c8,(Reader *)&f,expected_24);
      DynamicValue::Reader::~Reader(&local_7c8);
      name_x00102.content.size_ = 0xb;
      name_x00102.content.ptr = "structList";
      DynamicStruct::Reader::get((Reader *)&f,&reader,name_x00102);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&subSubReader,(Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if (subSubReader.reader.dataSize == 3) {
        DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,0);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Reader *)&listReader_1);
        name_x00103.content.size_ = 10;
        name_x00103.content.ptr = "textField";
        DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00103);
        local_800._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
        bVar6 = kj::operator==("structlist 1",(StringPtr *)&local_800);
        DynamicValue::Reader::~Reader((Reader *)&f);
        DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        if (!bVar6 && kj::_::Debug::minSeverity < 3) {
          DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,0);
          DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                    (&subReader,(Reader *)&listReader_1);
          name_x00104.content.size_ = 10;
          name_x00104.content.ptr = "textField";
          DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00104);
          local_800._0_16_ =
               DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
          kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x1b1,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                     ,(char (*) [119])
                      "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                     ,(char (*) [13])0x2da0bd,(Reader *)&local_800);
          DynamicValue::Reader::~Reader((Reader *)&f);
          DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        }
        DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,1);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Reader *)&listReader_1);
        name_x00105.content.size_ = 10;
        name_x00105.content.ptr = "textField";
        DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00105);
        local_800._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
        bVar6 = kj::operator==("structlist 2",(StringPtr *)&local_800);
        DynamicValue::Reader::~Reader((Reader *)&f);
        DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        if (!bVar6 && kj::_::Debug::minSeverity < 3) {
          DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,1);
          DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                    (&subReader,(Reader *)&listReader_1);
          name_x00106.content.size_ = 10;
          name_x00106.content.ptr = "textField";
          DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00106);
          local_800._0_16_ =
               DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
          kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x1b2,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                     ,(char (*) [119])
                      "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                     ,(char (*) [13])0x2cbc91,(Reader *)&local_800);
          DynamicValue::Reader::~Reader((Reader *)&f);
          DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        }
        DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,2);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Reader *)&listReader_1);
        name_x00107.content.size_ = 10;
        name_x00107.content.ptr = "textField";
        DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00107);
        local_800._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
        bVar6 = kj::operator==("structlist 3",(StringPtr *)&local_800);
        DynamicValue::Reader::~Reader((Reader *)&f);
        DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        if (!bVar6 && kj::_::Debug::minSeverity < 3) {
          DynamicList::Reader::operator[]((Reader *)&listReader_1,(Reader *)&subSubReader,2);
          DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                    (&subReader,(Reader *)&listReader_1);
          name_x00108.content.size_ = 10;
          name_x00108.content.ptr = "textField";
          DynamicStruct::Reader::get((Reader *)&f,&subReader,name_x00108);
          local_800._0_16_ =
               DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
          kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x1b3,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                     ,(char (*) [119])
                      "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                     ,(char (*) [13])0x2da261,(Reader *)&local_800);
          DynamicValue::Reader::~Reader((Reader *)&f);
          DynamicValue::Reader::~Reader((Reader *)&listReader_1);
        }
        sVar14 = 9;
        name_x00109.content.size_ = 9;
        name_x00109.content.ptr = "enumList";
        DynamicStruct::Reader::get(&local_738,&reader,name_x00109);
        pcStack_920 = "garply";
        f.exception = (Exception *)"foo";
        expected_25._M_len = sVar14;
        expected_25._M_array = (iterator)0x2;
        checkEnumList<capnp::DynamicValue::Reader>
                  ((anon_unknown_129 *)&local_738,(Reader *)&f,expected_25);
        DynamicValue::Reader::~Reader(&local_738);
        return;
      }
      listReader_1.schema.elementType.baseType = INT16;
      listReader_1.schema.elementType.listDepth = '\0';
      listReader_1.schema.elementType.isImplicitParam = false;
      subReader.schema.super_Schema.raw._0_4_ = (float)subSubReader.reader.dataSize;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b0,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",
                 (uint *)&listReader_1,(uint *)&subReader);
      kj::_::Debug::Fault::fatal(&f);
    }
    subSubReader.schema.super_Schema.raw._0_4_ = 4;
    subReader.schema.super_Schema.raw._0_4_ = (float)listReader_1.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a6,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               (uint *)&subSubReader,(uint *)&subReader);
    kj::_::Debug::Fault::fatal(&f);
  }
  subSubReader.schema.super_Schema.raw._0_4_ = 4;
  subReader.schema.super_Schema.raw._0_4_ = (float)listReader_1.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x19e,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
             (uint *)&subSubReader,(uint *)&subReader);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}